

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall
ChainstateManager::ChainstateManager
          (ChainstateManager *this,SignalInterrupt *interrupt,Options options,
          Options blockman_options)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  CChainParams *pCVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  _Storage<int,_true> _Var7;
  BlockManagerOpts *in_RCX;
  ChainstateManagerOpts *in_RDX;
  long in_FS_OFFSET;
  Options in_stack_ffffffffffffff58;
  arith_uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_last_notified_header = (CBlockIndex *)0x0;
  (this->m_last_presync_update).__d.__r = 0;
  this->m_active_chainstate = (Chainstate *)0x0;
  this->m_best_invalid = (CBlockIndex *)0x0;
  (this->m_ibd_chainstate)._M_t.super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>.
  _M_t.super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = (Chainstate *)0x0;
  (this->m_snapshot_chainstate)._M_t.
  super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
  super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
  super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = (Chainstate *)0x0;
  std::
  array<std::map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>,_29UL>
  ::array(&this->m_warningcache);
  CCheckQueue<CScriptCheck>::CCheckQueue
            (&this->m_script_check_queue,0x80,in_RDX->worker_threads_num);
  (this->snapshot_download_completed).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->snapshot_download_completed)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->snapshot_download_completed).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->snapshot_download_completed).super__Function_base._M_functor + 8) =
       0;
  (this->time_chainstate).__r = 0;
  (this->time_post_connect).__r = 0;
  (this->time_connect_total).__r = 0;
  (this->time_flush).__r = 0;
  (this->time_total).__r = 0;
  this->num_blocks_total = 0;
  (this->time_undo).__r = 0;
  (this->time_index).__r = 0;
  (this->time_connect).__r = 0;
  (this->time_verify).__r = 0;
  (this->time_check).__r = 0;
  (this->time_forks).__r = 0;
  this->m_interrupt = interrupt;
  if ((in_RDX->check_block_index).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged == false) {
    bVar2 = in_RDX->chainparams->fDefaultConsistencyChecks;
    (in_RDX->check_block_index).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int>._M_engaged = true;
    _Var7._M_value._1_3_ = 0;
    _Var7._M_value._0_1_ = bVar2;
    (in_RDX->check_block_index).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int>._M_payload = _Var7;
  }
  if ((in_RDX->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>._M_payload.
      super__Optional_payload_base<arith_uint256>._M_engaged == false) {
    UintToArith256(&local_58,&(in_RDX->chainparams->consensus).nMinimumChainWork);
    std::optional<arith_uint256>::operator=(&in_RDX->minimum_chain_work,&local_58);
  }
  if ((in_RDX->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_engaged == false) {
    pCVar3 = in_RDX->chainparams;
    uVar4 = *(undefined8 *)
             ((pCVar3->consensus).defaultAssumeValid.super_base_blob<256U>.m_data._M_elems + 8);
    uVar5 = *(undefined8 *)
             ((pCVar3->consensus).defaultAssumeValid.super_base_blob<256U>.m_data._M_elems + 0x10);
    uVar6 = *(undefined8 *)
             ((pCVar3->consensus).defaultAssumeValid.super_base_blob<256U>.m_data._M_elems + 0x18);
    *(undefined8 *)
     &(in_RDX->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
      super__Optional_payload_base<uint256>._M_payload =
         *(undefined8 *)(pCVar3->consensus).defaultAssumeValid.super_base_blob<256U>.m_data._M_elems
    ;
    *(undefined8 *)
     ((long)&(in_RDX->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload + 8) = uVar4;
    *(undefined8 *)
     ((long)&(in_RDX->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload + 0x10) = uVar5;
    *(undefined8 *)
     ((long)&(in_RDX->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
             super__Optional_payload_base<uint256>._M_payload + 0x18) = uVar6;
    (in_RDX->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
    super__Optional_payload_base<uint256>._M_engaged = true;
  }
  kernel::ChainstateManagerOpts::ChainstateManagerOpts(&this->m_options,in_RDX);
  kernel::BlockManagerOpts::BlockManagerOpts((BlockManagerOpts *)&stack0xffffffffffffff58,in_RCX);
  ::node::BlockManager::BlockManager(&this->m_blockman,interrupt,in_stack_ffffffffffffff58);
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff78);
  ValidationCache::ValidationCache
            (&this->m_validation_cache,(this->m_options).script_execution_cache_bytes,
             (this->m_options).signature_cache_bytes);
  (this->m_cached_finished_ibd)._M_base._M_i = false;
  this->nBlockSequenceId = 1;
  this->nBlockReverseSequenceId = -1;
  base_uint<256U>::base_uint(&(this->nLastPreciousChainwork).super_base_uint<256U>,0);
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_best_header = (CBlockIndex *)0x0;
  this->m_total_coinstip_cache = 0;
  this->m_total_coinsdb_cache = 0;
  VersionBitsCache::VersionBitsCache(&this->m_versionbitscache);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ChainstateManager::ChainstateManager(const util::SignalInterrupt& interrupt, Options options, node::BlockManager::Options blockman_options)
    : m_script_check_queue{/*batch_size=*/128, options.worker_threads_num},
      m_interrupt{interrupt},
      m_options{Flatten(std::move(options))},
      m_blockman{interrupt, std::move(blockman_options)},
      m_validation_cache{m_options.script_execution_cache_bytes, m_options.signature_cache_bytes}
{
}